

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool polish)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  char cVar2;
  undefined8 uVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  uint uVar9;
  DataKey DVar10;
  ulong uVar11;
  int nr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  int local_52c;
  DataKey local_528;
  uint local_51c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_518;
  uint local_4dc;
  cpp_dec_float<50U,_int,_void> local_4d8;
  longlong local_4a0;
  undefined1 local_498 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_490;
  uint local_488 [3];
  undefined3 uStack_47b;
  uint local_478;
  undefined3 uStack_473;
  int local_470;
  bool local_46c;
  undefined8 local_468;
  cpp_dec_float<50U,_int,_void> local_458;
  cpp_dec_float<50U,_int,_void> local_418;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  undefined1 local_a0 [56];
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_528.info = 0;
  local_528.idx = -1;
  local_518.m_backend.fpclass = cpp_dec_float_finite;
  local_518.m_backend.prec_elem = 10;
  local_518.m_backend.data._M_elems[0] = 0;
  local_518.m_backend.data._M_elems[1] = 0;
  local_518.m_backend.data._M_elems[2] = 0;
  local_518.m_backend.data._M_elems[3] = 0;
  local_518.m_backend.data._M_elems[4] = 0;
  local_518.m_backend.data._M_elems[5] = 0;
  local_518.m_backend.data._M_elems._24_5_ = 0;
  local_518.m_backend.data._M_elems[7]._1_3_ = 0;
  local_518.m_backend.data._M_elems._32_5_ = 0;
  local_518.m_backend.data._M_elems[9]._1_3_ = 0;
  local_518.m_backend.exp = 0;
  local_518.m_backend.neg = false;
  local_3d8.m_backend.fpclass = cpp_dec_float_finite;
  local_3d8.m_backend.prec_elem = 10;
  local_3d8.m_backend.data._M_elems[0] = 0;
  local_3d8.m_backend.data._M_elems[1] = 0;
  local_3d8.m_backend.data._M_elems[2] = 0;
  local_3d8.m_backend.data._M_elems[3] = 0;
  local_3d8.m_backend.data._M_elems[4] = 0;
  local_3d8.m_backend.data._M_elems[5] = 0;
  local_3d8.m_backend.data._M_elems._24_5_ = 0;
  local_3d8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_3d8.m_backend.data._M_elems._32_5_ = 0;
  local_3d8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_3d8.m_backend.exp = 0;
  local_3d8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_4d8,0.0,(type *)0x0);
  psVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_a0,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar11 = -(ulong)(*(Real *)(local_a0._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,
             (double)(~uVar11 & (ulong)(*(Real *)(local_a0._0_8_ + 0x40) * 1e-05) |
                     uVar11 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  resetTols(this);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  cVar2 = *(char *)(CONCAT44(extraout_var,iVar6) + 0x670);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_498,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar11 = -(ulong)(*(Real *)((long)local_498 + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)local_a0,
             (double)(~uVar11 & (ulong)(*(Real *)((long)local_498 + 0x40) * 1e-10) |
                     uVar11 & 0x3ddb7cdfd9d7bdbb),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_490);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_3d8,0.0);
  pnVar8 = &this->epsilon;
  uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
  _local_478 = (undefined5)uVar3;
  uStack_473 = (undefined3)((ulong)uVar3 >> 0x28);
  local_498 = *(undefined1 (*) [8])(this->epsilon).m_backend.data._M_elems;
  _Stack_490._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        ((this->epsilon).m_backend.data._M_elems + 2);
  local_488._0_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
  stack0xfffffffffffffb80 = (undefined5)uVar3;
  uStack_47b = (undefined3)((ulong)uVar3 >> 0x28);
  local_470 = (this->epsilon).m_backend.exp;
  local_46c = (this->epsilon).m_backend.neg;
  local_468._0_4_ = (this->epsilon).m_backend.fpclass;
  local_468._4_4_ = (this->epsilon).m_backend.prec_elem;
  tVar4 = boost::multiprecision::operator>
                    (val,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_498);
  local_4dc = (uint)CONCAT71(in_register_00000009,polish);
  local_3a0 = pnVar8;
  if (tVar4) {
    iVar6 = 0;
    uVar9 = (uint)polish;
    local_51c = (uint)polish;
    do {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_4d8,0.0);
      local_518.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_518.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_518.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      local_518.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_518.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_518.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_518.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_518.m_backend.exp = (val->m_backend).exp;
      local_518.m_backend.neg = (val->m_backend).neg;
      local_518.m_backend.fpclass = (val->m_backend).fpclass;
      local_518.m_backend.prec_elem = (val->m_backend).prec_elem;
      local_528 = (DataKey)maxDelta(this,&local_52c,&local_518,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_4d8);
      DVar10 = local_528;
      if (local_528.info == 0) goto LAB_00243977;
      local_d8.m_backend.data._M_elems[7]._1_3_ = local_518.m_backend.data._M_elems[7]._1_3_;
      local_d8.m_backend.data._M_elems._24_5_ = local_518.m_backend.data._M_elems._24_5_;
      local_d8.m_backend.data._M_elems[0] = local_518.m_backend.data._M_elems[0];
      local_d8.m_backend.data._M_elems[1] = local_518.m_backend.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = local_518.m_backend.data._M_elems[2];
      local_d8.m_backend.data._M_elems[3] = local_518.m_backend.data._M_elems[3];
      local_d8.m_backend.data._M_elems[4] = local_518.m_backend.data._M_elems[4];
      local_d8.m_backend.data._M_elems[5] = local_518.m_backend.data._M_elems[5];
      local_d8.m_backend.data._M_elems[9]._1_3_ = local_518.m_backend.data._M_elems[9]._1_3_;
      local_d8.m_backend.data._M_elems._32_5_ = local_518.m_backend.data._M_elems._32_5_;
      local_d8.m_backend.exp = local_518.m_backend.exp;
      local_d8.m_backend.neg = local_518.m_backend.neg;
      local_d8.m_backend.fpclass = local_518.m_backend.fpclass;
      local_d8.m_backend.prec_elem = local_518.m_backend.prec_elem;
      local_118.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
      local_118.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
      local_118.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
      local_118.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
      local_118.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
      local_118.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
      local_118.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
      local_118.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
      local_118.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
      local_118.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
      local_118.m_backend.exp = local_4d8.exp;
      local_118.m_backend.neg = local_4d8.neg;
      local_118.m_backend.fpclass = local_4d8.fpclass;
      local_118.m_backend.prec_elem = local_4d8.prec_elem;
      bVar5 = shortEnter(this,(SPxId *)&local_528,local_52c,&local_d8,&local_118);
      if (!bVar5) {
        local_468._0_4_ = cpp_dec_float_finite;
        local_468._4_4_ = 10;
        local_498 = (undefined1  [8])0x0;
        _Stack_490._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_488[0] = 0;
        local_488[1] = 0;
        stack0xfffffffffffffb80 = 0;
        uStack_47b = 0;
        _local_478 = 0;
        uStack_473 = 0;
        local_470 = 0;
        local_46c = false;
        local_418.fpclass = cpp_dec_float_finite;
        local_418.prec_elem = 10;
        local_418.data._M_elems[0] = 0;
        local_418.data._M_elems[1] = 0;
        local_418.data._M_elems[2] = 0;
        local_418.data._M_elems[3] = 0;
        local_418.data._M_elems[4] = 0;
        local_418.data._M_elems[5] = 0;
        local_418.data._M_elems._24_5_ = 0;
        local_418.data._M_elems[7]._1_3_ = 0;
        local_418.data._M_elems._32_5_ = 0;
        local_418.data._M_elems[9]._1_3_ = 0;
        local_418.exp = 0;
        local_418.neg = false;
        local_158.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
        local_158.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
        local_158.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
        local_158.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
        local_158.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
        local_158.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
        local_158.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
        local_158.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
        local_158.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
        local_158.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
        local_158.m_backend.exp = local_4d8.exp;
        local_158.m_backend.neg = local_4d8.neg;
        local_158.m_backend.fpclass = local_4d8.fpclass;
        local_158.m_backend.prec_elem = local_4d8.prec_elem;
        minStability((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_458,this,&local_158);
        local_418.data._M_elems._32_5_ = local_458.data._M_elems._32_5_;
        local_418.data._M_elems[9]._1_3_ = local_458.data._M_elems[9]._1_3_;
        local_418.data._M_elems[4] = local_458.data._M_elems[4];
        local_418.data._M_elems[5] = local_458.data._M_elems[5];
        local_418.data._M_elems._24_5_ = local_458.data._M_elems._24_5_;
        local_418.data._M_elems[7]._1_3_ = local_458.data._M_elems[7]._1_3_;
        local_418.data._M_elems[0] = local_458.data._M_elems[0];
        local_418.data._M_elems[1] = local_458.data._M_elems[1];
        local_418.data._M_elems[2] = local_458.data._M_elems[2];
        local_418.data._M_elems[3] = local_458.data._M_elems[3];
        local_418.exp = local_458.exp;
        local_418.neg = local_458.neg;
        local_418.fpclass = local_458.fpclass;
        local_418.prec_elem = local_458.prec_elem;
        if (cVar2 == '\0') {
          local_1d8.m_backend.data._M_elems[9]._1_3_ = local_518.m_backend.data._M_elems[9]._1_3_;
          local_1d8.m_backend.data._M_elems._32_5_ = local_518.m_backend.data._M_elems._32_5_;
          local_1d8.m_backend.data._M_elems[7]._1_3_ = local_518.m_backend.data._M_elems[7]._1_3_;
          local_1d8.m_backend.data._M_elems._24_5_ = local_518.m_backend.data._M_elems._24_5_;
          local_1d8.m_backend.data._M_elems[4] = local_518.m_backend.data._M_elems[4];
          local_1d8.m_backend.data._M_elems[5] = local_518.m_backend.data._M_elems[5];
          local_1d8.m_backend.data._M_elems[0] = local_518.m_backend.data._M_elems[0];
          local_1d8.m_backend.data._M_elems[1] = local_518.m_backend.data._M_elems[1];
          local_1d8.m_backend.data._M_elems[2] = local_518.m_backend.data._M_elems[2];
          local_1d8.m_backend.data._M_elems[3] = local_518.m_backend.data._M_elems[3];
          local_1d8.m_backend.exp = local_518.m_backend.exp;
          local_1d8.m_backend.neg = local_518.m_backend.neg;
          local_1d8.m_backend.fpclass = local_518.m_backend.fpclass;
          local_1d8.m_backend.prec_elem = local_518.m_backend.prec_elem;
          pcVar7 = &local_418;
          pnVar8 = &local_1d8;
        }
        else {
          local_198.m_backend.data._M_elems[9]._1_3_ = local_518.m_backend.data._M_elems[9]._1_3_;
          local_198.m_backend.data._M_elems._32_5_ = local_518.m_backend.data._M_elems._32_5_;
          local_198.m_backend.data._M_elems[7]._1_3_ = local_518.m_backend.data._M_elems[7]._1_3_;
          local_198.m_backend.data._M_elems._24_5_ = local_518.m_backend.data._M_elems._24_5_;
          local_198.m_backend.data._M_elems[4] = local_518.m_backend.data._M_elems[4];
          local_198.m_backend.data._M_elems[5] = local_518.m_backend.data._M_elems[5];
          local_198.m_backend.data._M_elems[0] = local_518.m_backend.data._M_elems[0];
          local_198.m_backend.data._M_elems[1] = local_518.m_backend.data._M_elems[1];
          local_198.m_backend.data._M_elems[2] = local_518.m_backend.data._M_elems[2];
          local_198.m_backend.data._M_elems[3] = local_518.m_backend.data._M_elems[3];
          local_198.m_backend.exp = local_518.m_backend.exp;
          local_198.m_backend.neg = local_518.m_backend.neg;
          local_198.m_backend.fpclass = local_518.m_backend.fpclass;
          local_198.m_backend.prec_elem = local_518.m_backend.prec_elem;
          pcVar7 = (cpp_dec_float<50U,_int,_void> *)local_a0;
          pnVar8 = &local_198;
        }
        local_528 = (DataKey)maxSelect(this,&local_52c,&local_3d8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)pcVar7,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)local_498,pnVar8);
        local_458.fpclass = cpp_dec_float_finite;
        local_458.prec_elem = 10;
        local_458.data._M_elems[0] = 0;
        local_458.data._M_elems[1] = 0;
        local_458.data._M_elems[2] = 0;
        local_458.data._M_elems[3] = 0;
        local_458.data._M_elems[4] = 0;
        local_458.data._M_elems[5] = 0;
        local_458.data._M_elems._24_5_ = 0;
        local_458.data._M_elems[7]._1_3_ = 0;
        local_458.data._M_elems._32_5_ = 0;
        local_458.data._M_elems[9]._1_3_ = 0;
        local_458.exp = 0;
        local_458.neg = false;
        local_4a0 = 2;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (&local_458,&local_68,&local_4a0);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_498,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_458);
        iVar6 = (iVar6 - (uint)tVar4) + 2;
        uVar9 = local_51c;
      }
      local_218.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
      local_218.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
      local_218.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
      local_218.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
      local_218.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
      local_218.m_backend.exp = local_4d8.exp;
      local_218.m_backend.neg = local_4d8.neg;
      local_218.m_backend.fpclass = local_4d8.fpclass;
      local_218.m_backend.prec_elem = local_4d8.prec_elem;
      bVar5 = maxReEnter(this,&local_3d8,&local_218,(SPxId *)&local_528,local_52c,SUB41(uVar9,0));
    } while ((bVar5) && (relax(this), iVar6 < 2));
  }
  else {
    uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
    _local_478 = (undefined5)uVar3;
    uStack_473 = (undefined3)((ulong)uVar3 >> 0x28);
    local_498 = *(undefined1 (*) [8])(pnVar8->m_backend).data._M_elems;
    _Stack_490._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          ((this->epsilon).m_backend.data._M_elems + 2);
    local_488._0_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
    uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
    stack0xfffffffffffffb80 = (undefined5)uVar3;
    uStack_47b = (undefined3)((ulong)uVar3 >> 0x28);
    local_470 = (this->epsilon).m_backend.exp;
    local_46c = (this->epsilon).m_backend.neg;
    local_468._0_4_ = (this->epsilon).m_backend.fpclass;
    local_468._4_4_ = (this->epsilon).m_backend.prec_elem;
    if ((fpclass_type)local_468 != cpp_dec_float_finite || local_498._0_4_ != 0) {
      local_46c = (bool)(local_46c ^ 1);
    }
    tVar4 = boost::multiprecision::operator<
                      (val,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_498);
    if (tVar4) {
      iVar6 = 0;
      uVar9 = local_4dc & 0xff;
      local_51c = local_4dc & 0xff;
      do {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_4d8,0.0);
        local_518.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
        local_518.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((val->m_backend).data._M_elems + 2);
        local_518.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((val->m_backend).data._M_elems + 4);
        uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
        local_518.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_518.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
        local_518.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_518.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_518.m_backend.exp = (val->m_backend).exp;
        local_518.m_backend.neg = (val->m_backend).neg;
        local_518.m_backend.fpclass = (val->m_backend).fpclass;
        local_518.m_backend.prec_elem = (val->m_backend).prec_elem;
        local_528 = (DataKey)minDelta(this,&local_52c,&local_518,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&local_4d8);
        DVar10 = local_528;
        if (local_528.info == 0) goto LAB_00243977;
        local_258.m_backend.data._M_elems[7]._1_3_ = local_518.m_backend.data._M_elems[7]._1_3_;
        local_258.m_backend.data._M_elems._24_5_ = local_518.m_backend.data._M_elems._24_5_;
        local_258.m_backend.data._M_elems[0] = local_518.m_backend.data._M_elems[0];
        local_258.m_backend.data._M_elems[1] = local_518.m_backend.data._M_elems[1];
        local_258.m_backend.data._M_elems[2] = local_518.m_backend.data._M_elems[2];
        local_258.m_backend.data._M_elems[3] = local_518.m_backend.data._M_elems[3];
        local_258.m_backend.data._M_elems[4] = local_518.m_backend.data._M_elems[4];
        local_258.m_backend.data._M_elems[5] = local_518.m_backend.data._M_elems[5];
        local_258.m_backend.data._M_elems[9]._1_3_ = local_518.m_backend.data._M_elems[9]._1_3_;
        local_258.m_backend.data._M_elems._32_5_ = local_518.m_backend.data._M_elems._32_5_;
        local_258.m_backend.exp = local_518.m_backend.exp;
        local_258.m_backend.neg = local_518.m_backend.neg;
        local_258.m_backend.fpclass = local_518.m_backend.fpclass;
        local_258.m_backend.prec_elem = local_518.m_backend.prec_elem;
        local_298.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
        local_298.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
        local_298.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
        local_298.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
        local_298.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
        local_298.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
        local_298.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
        local_298.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
        local_298.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
        local_298.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
        local_298.m_backend.exp = local_4d8.exp;
        local_298.m_backend.neg = local_4d8.neg;
        local_298.m_backend.fpclass = local_4d8.fpclass;
        local_298.m_backend.prec_elem = local_4d8.prec_elem;
        bVar5 = shortEnter(this,(SPxId *)&local_528,local_52c,&local_258,&local_298);
        if (!bVar5) {
          local_468._0_4_ = cpp_dec_float_finite;
          local_468._4_4_ = 10;
          local_498 = (undefined1  [8])0x0;
          _Stack_490._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_488[0] = 0;
          local_488[1] = 0;
          stack0xfffffffffffffb80 = 0;
          uStack_47b = 0;
          _local_478 = 0;
          uStack_473 = 0;
          local_470 = 0;
          local_46c = false;
          local_418.fpclass = cpp_dec_float_finite;
          local_418.prec_elem = 10;
          local_418.data._M_elems[0] = 0;
          local_418.data._M_elems[1] = 0;
          local_418.data._M_elems[2] = 0;
          local_418.data._M_elems[3] = 0;
          local_418.data._M_elems[4] = 0;
          local_418.data._M_elems[5] = 0;
          local_418.data._M_elems._24_5_ = 0;
          local_418.data._M_elems[7]._1_3_ = 0;
          local_418.data._M_elems._32_5_ = 0;
          local_418.data._M_elems[9]._1_3_ = 0;
          local_418.exp = 0;
          local_418.neg = false;
          local_2d8.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
          local_2d8.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
          local_2d8.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
          local_2d8.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
          local_2d8.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
          local_2d8.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
          local_2d8.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
          local_2d8.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
          local_2d8.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
          local_2d8.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
          local_2d8.m_backend.exp = local_4d8.exp;
          local_2d8.m_backend.neg = local_4d8.neg;
          local_2d8.m_backend.fpclass = local_4d8.fpclass;
          local_2d8.m_backend.prec_elem = local_4d8.prec_elem;
          minStability((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_458,this,&local_2d8);
          local_418.data._M_elems._32_5_ = local_458.data._M_elems._32_5_;
          local_418.data._M_elems[9]._1_3_ = local_458.data._M_elems[9]._1_3_;
          local_418.data._M_elems[4] = local_458.data._M_elems[4];
          local_418.data._M_elems[5] = local_458.data._M_elems[5];
          local_418.data._M_elems._24_5_ = local_458.data._M_elems._24_5_;
          local_418.data._M_elems[7]._1_3_ = local_458.data._M_elems[7]._1_3_;
          local_418.data._M_elems[0] = local_458.data._M_elems[0];
          local_418.data._M_elems[1] = local_458.data._M_elems[1];
          local_418.data._M_elems[2] = local_458.data._M_elems[2];
          local_418.data._M_elems[3] = local_458.data._M_elems[3];
          local_418.exp = local_458.exp;
          local_418.neg = local_458.neg;
          local_418.fpclass = local_458.fpclass;
          local_418.prec_elem = local_458.prec_elem;
          if (cVar2 == '\0') {
            local_358.m_backend.data._M_elems[9]._1_3_ = local_518.m_backend.data._M_elems[9]._1_3_;
            local_358.m_backend.data._M_elems._32_5_ = local_518.m_backend.data._M_elems._32_5_;
            local_358.m_backend.data._M_elems[7]._1_3_ = local_518.m_backend.data._M_elems[7]._1_3_;
            local_358.m_backend.data._M_elems._24_5_ = local_518.m_backend.data._M_elems._24_5_;
            local_358.m_backend.data._M_elems[4] = local_518.m_backend.data._M_elems[4];
            local_358.m_backend.data._M_elems[5] = local_518.m_backend.data._M_elems[5];
            local_358.m_backend.data._M_elems[0] = local_518.m_backend.data._M_elems[0];
            local_358.m_backend.data._M_elems[1] = local_518.m_backend.data._M_elems[1];
            local_358.m_backend.data._M_elems[2] = local_518.m_backend.data._M_elems[2];
            local_358.m_backend.data._M_elems[3] = local_518.m_backend.data._M_elems[3];
            local_358.m_backend.exp = local_518.m_backend.exp;
            local_358.m_backend.neg = local_518.m_backend.neg;
            local_358.m_backend.fpclass = local_518.m_backend.fpclass;
            local_358.m_backend.prec_elem = local_518.m_backend.prec_elem;
            pcVar7 = &local_418;
            pnVar8 = &local_358;
          }
          else {
            local_318.m_backend.data._M_elems[9]._1_3_ = local_518.m_backend.data._M_elems[9]._1_3_;
            local_318.m_backend.data._M_elems._32_5_ = local_518.m_backend.data._M_elems._32_5_;
            local_318.m_backend.data._M_elems[7]._1_3_ = local_518.m_backend.data._M_elems[7]._1_3_;
            local_318.m_backend.data._M_elems._24_5_ = local_518.m_backend.data._M_elems._24_5_;
            local_318.m_backend.data._M_elems[4] = local_518.m_backend.data._M_elems[4];
            local_318.m_backend.data._M_elems[5] = local_518.m_backend.data._M_elems[5];
            local_318.m_backend.data._M_elems[0] = local_518.m_backend.data._M_elems[0];
            local_318.m_backend.data._M_elems[1] = local_518.m_backend.data._M_elems[1];
            local_318.m_backend.data._M_elems[2] = local_518.m_backend.data._M_elems[2];
            local_318.m_backend.data._M_elems[3] = local_518.m_backend.data._M_elems[3];
            local_318.m_backend.exp = local_518.m_backend.exp;
            local_318.m_backend.neg = local_518.m_backend.neg;
            local_318.m_backend.fpclass = local_518.m_backend.fpclass;
            local_318.m_backend.prec_elem = local_518.m_backend.prec_elem;
            pcVar7 = (cpp_dec_float<50U,_int,_void> *)local_a0;
            pnVar8 = &local_318;
          }
          local_528 = (DataKey)minSelect(this,&local_52c,&local_3d8,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)pcVar7,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)local_498,pnVar8);
          local_458.fpclass = cpp_dec_float_finite;
          local_458.prec_elem = 10;
          local_458.data._M_elems[0] = 0;
          local_458.data._M_elems[1] = 0;
          local_458.data._M_elems[2] = 0;
          local_458.data._M_elems[3] = 0;
          local_458.data._M_elems[4] = 0;
          local_458.data._M_elems[5] = 0;
          local_458.data._M_elems._24_5_ = 0;
          local_458.data._M_elems[7]._1_3_ = 0;
          local_458.data._M_elems._32_5_ = 0;
          local_458.data._M_elems[9]._1_3_ = 0;
          local_458.exp = 0;
          local_458.neg = false;
          local_4a0 = 2;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                    (&local_458,&local_68,&local_4a0);
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_498,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_458);
          iVar6 = (iVar6 - (uint)tVar4) + 2;
          uVar9 = local_51c;
        }
        local_398.m_backend.data._M_elems[8] = local_4d8.data._M_elems[8];
        local_398.m_backend.data._M_elems[9] = local_4d8.data._M_elems[9];
        local_398.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
        local_398.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
        local_398.m_backend.data._M_elems[6] = local_4d8.data._M_elems[6];
        local_398.m_backend.data._M_elems[7] = local_4d8.data._M_elems[7];
        local_398.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
        local_398.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
        local_398.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
        local_398.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
        local_398.m_backend.exp = local_4d8.exp;
        local_398.m_backend.neg = local_4d8.neg;
        local_398.m_backend.fpclass = local_4d8.fpclass;
        local_398.m_backend.prec_elem = local_4d8.prec_elem;
        bVar5 = minReEnter(this,&local_3d8,&local_398,(SPxId *)&local_528,local_52c,SUB41(uVar9,0));
      } while ((bVar5) && (relax(this), iVar6 < 2));
    }
  }
  pnVar8 = local_3a0;
  DVar10.info = 0;
  DVar10.idx = -1;
  if ((char)local_4dc == '\0') {
LAB_00243871:
    if (local_528.info == 0) goto LAB_0024387f;
    bVar5 = false;
LAB_0024391c:
    *(ulong *)((val->m_backend).data._M_elems + 8) =
         CONCAT35(local_3d8.m_backend.data._M_elems[9]._1_3_,
                  local_3d8.m_backend.data._M_elems._32_5_);
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_3d8.m_backend.data._M_elems._16_8_;
    *(ulong *)((val->m_backend).data._M_elems + 6) =
         CONCAT35(local_3d8.m_backend.data._M_elems[7]._1_3_,
                  local_3d8.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(val->m_backend).data._M_elems = local_3d8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_3d8.m_backend.data._M_elems._8_8_;
    (val->m_backend).exp = local_3d8.m_backend.exp;
    (val->m_backend).neg = local_3d8.m_backend.neg;
    (val->m_backend).fpclass = local_3d8.m_backend.fpclass;
    (val->m_backend).prec_elem = local_3d8.m_backend.prec_elem;
    if (!bVar5) {
      tighten(this);
    }
  }
  else {
    if (local_528.info != 0) {
      this_00 = (this->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      if (this_00->polishObj == POLISH_FRACTIONALITY) {
        if ((this_00->integerVariables).thesize ==
            (this_00->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
          if ((0 < local_528.info) &&
             (iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number(&this_00->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ,(SPxId *)&local_528), (this_00->integerVariables).data[iVar6] == 1))
          {
LAB_00243996:
            local_528.info = 0;
            local_528.idx = 0;
            goto LAB_00243977;
          }
        }
        else if (0 < local_528.info) goto LAB_00243996;
      }
      else if ((this_00->polishObj == POLISH_INTEGRALITY) &&
              ((local_528.info < 0 ||
               (((this_00->integerVariables).thesize ==
                 (this_00->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum &&
                (iVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::number(&this_00->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,(SPxId *)&local_528),
                (this_00->integerVariables).data[iVar6] == 0)))))) goto LAB_00243996;
      goto LAB_00243871;
    }
LAB_0024387f:
    uVar3 = *(undefined8 *)((pnVar8->m_backend).data._M_elems + 8);
    local_418.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_418.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_418.data._M_elems._0_8_ = *(undefined8 *)(pnVar8->m_backend).data._M_elems;
    local_418.data._M_elems._8_8_ = *(undefined8 *)((pnVar8->m_backend).data._M_elems + 2);
    local_418.data._M_elems._16_8_ = *(undefined8 *)((pnVar8->m_backend).data._M_elems + 4);
    uVar3 = *(undefined8 *)((pnVar8->m_backend).data._M_elems + 6);
    local_418.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_418.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_418.exp = (this->epsilon).m_backend.exp;
    local_418.neg = (this->epsilon).m_backend.neg;
    local_418.fpclass = (this->epsilon).m_backend.fpclass;
    local_418.prec_elem = (this->epsilon).m_backend.prec_elem;
    local_468._0_4_ = cpp_dec_float_finite;
    local_468._4_4_ = 10;
    local_498 = (undefined1  [8])0x0;
    _Stack_490._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_488[0] = 0;
    local_488[1] = 0;
    stack0xfffffffffffffb80 = 0;
    uStack_47b = 0;
    _local_478 = 0;
    uStack_473 = 0;
    local_470 = 0;
    local_46c = false;
    local_458.data._M_elems[0] = 2;
    local_458.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_498,&local_418,(longlong *)&local_458);
    tVar4 = boost::multiprecision::operator>
                      (&this->minStab,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_498);
    if (tVar4) {
      bVar5 = local_528.info == 0;
      goto LAB_0024391c;
    }
  }
  DVar10 = (DataKey)((ulong)local_528 & 0xffffffff00000000);
LAB_00243977:
  return (SPxId)((ulong)local_528 & 0xffffffff | DVar10);
}

Assistant:

SPxId SPxFastRT<R>::selectEnter(R& val, int, bool polish)
{
   SPxId enterId;
   R max, sel;
   R maxabs = 0.0;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int nr;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::LEAVE);

   resetTols();

   // force instable pivot iff true (see explanation in leave.hpp and spxsolve.hpp)
   bool instable = this->solver()->instableLeave;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableLeaveNum >= 0);

   sel = 0.0;

   if(val > epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;

         enterId = maxDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max >= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = maxSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = maxSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;
         enterId = minDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max <= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = minSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = minSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }

   SPX_DEBUG(

      if(enterId.isValid())
{
   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

      R x;

      if(this->thesolver->isCoId(enterId))
         x = this->thesolver->coPvec().delta()[ this->thesolver->number(enterId) ];
      else
         x = this->thesolver->pVec().delta()[ this->thesolver->number(enterId) ];

      std::cout << "DFSTRT03 " << this->thesolver->basis().iteration() << ": "
                << sel << '\t' << x << " (" << maxabs << ")" << std::endl;
   }
   else
      std::cout << "DFSTRT04 " << this->thesolver->basis().iteration()
                << ": skipping instable pivot" << std::endl;
      )

      if(polish && enterId.isValid())
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);

         // decide whether the chosen entering index contributes to the polishing objective
         if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
         {
            // only allow (integer) variables to enter the basis
            if(enterId.isSPxRowId())
               return SPxId();
            else if(this->thesolver->integerVariables.size() == this->thesolver->nCols()
                    && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 0)
               return SPxId();
         }
         else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
         {
            // only allow slacks and continuous variables to enter the basis
            if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
            {
               if(enterId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 1)
                  return SPxId();
            }
            else if(enterId.isSPxColId())
               return SPxId();
         }
      }


   if(enterId.isValid() || minStab > 2 * epsilonZero())
   {
      val = sel;

      if(enterId.isValid())
         tighten();
   }

   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

   return enterId;
}